

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.hpp
# Opt level: O0

string * string_utils::join(string *__return_storage_ptr__,
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *strings,string *split)

{
  size_type sVar1;
  const_reference pvVar2;
  undefined4 local_28;
  int i;
  string *split_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *strings_local;
  string *res;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_28 = 0;
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(strings), (ulong)(long)local_28 < sVar1; local_28 = local_28 + 1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](strings,(long)local_28);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pvVar2);
    if (local_28 != 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)split);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static string join(const vector<string>& strings, string split) {
    string res;
    for (int i = 0; i < strings.size(); i++) {
      res += strings[i];
      if (i != 0) res += split;
    }
    return res;
  }